

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operand.h
# Opt level: O1

error __thiscall ldg::size(ldg *this,context *ctx,token *token,opcode *op)

{
  int iVar1;
  _Storage<unsigned_long,_true> _Var2;
  _Storage<unsigned_long,_true> _Var3;
  string_view prefix;
  optional<unsigned_long> oVar4;
  token local_58;
  
  prefix._M_str = ".";
  prefix._M_len = 1;
  oVar4 = find_in_table(token,size::table,prefix);
  _Var2._M_value =
       oVar4.super__Optional_base<unsigned_long,_true,_true>._M_payload.
       super__Optional_payload_base<unsigned_long>._M_payload;
  _Var3._M_value = 4;
  if (((undefined1  [16])
       oVar4.super__Optional_base<unsigned_long,_true,_true>._M_payload.
       super__Optional_payload_base<unsigned_long> & (undefined1  [16])0x1) != (undefined1  [16])0x0
     ) {
    context::tokenize(&local_58,ctx);
    token->column = local_58.column;
    (token->data).string._M_str = local_58.data.string._M_str;
    token->type = local_58.type;
    token->line = local_58.line;
    token->filename = local_58.filename;
    (token->data).predicate = local_58.data.predicate;
    _Var3._M_value = _Var2._M_value;
    if (_Var2._M_value == 7) {
      iVar1 = equal(token,".128");
      if (iVar1 == 0) {
        fail((token *)this,(char *)token,size::msg);
        return (unique_ptr<char[],_std::default_delete<char[]>_>)
               (unique_ptr<char[],_std::default_delete<char[]>_>)this;
      }
      context::tokenize(&local_58,ctx);
      token->column = local_58.column;
      (token->data).string._M_str = local_58.data.string._M_str;
      token->type = local_58.type;
      token->line = local_58.line;
      token->filename = local_58.filename;
      (token->data).predicate = local_58.data.predicate;
    }
  }
  if ((op->value & _Var3._M_value << 0x30) == 0) {
    op->value = op->value | _Var3._M_value << 0x30;
    *(undefined8 *)this = 0;
    return (unique_ptr<char[],_std::default_delete<char[]>_>)
           (unique_ptr<char[],_std::default_delete<char[]>_>)this;
  }
  __assert_fail("(value & bits) == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ReinUsesLisp[P]nxas/src/opcode.h"
                ,0x31,"void opcode::add_bits(uint64_t)");
}

Assistant:

DEFINE_OPERAND(size)
    {
        static const char* table[] = {"U8", "S8", "U16", "S16", "32", "64", "128", "U"};
        static const char* msg = "expected .U8, .S8, .U16, .S16, .32, .64, .128 or .U.128";

        const std::optional result = find_in_table(token, table, ".");
        if (result) {
            token = ctx.tokenize();
            if (*result == 7) { // .U
                if (!equal(token, ".128")) {
                    return fail(token, msg);
                }
                token = ctx.tokenize();
            }
        }
        op.add_bits(result.value_or(4) << 48);
        return {};
    }